

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

string * __thiscall
jbcoin::ValidatorToken::toString_abi_cxx11_(string *__return_storage_ptr__,ValidatorToken *this)

{
  jbcoin *this_00;
  size_t sVar1;
  Value *pVVar2;
  int in_ECX;
  Value *value;
  string local_98;
  Value local_78 [2];
  string local_58;
  Value local_38;
  undefined1 local_28 [8];
  Value jv;
  ValidatorToken *this_local;
  
  jv._8_8_ = this;
  Json::Value::Value((Value *)local_28,nullValue);
  this_00 = (jbcoin *)SecretKey::data(&this->secretKey);
  sVar1 = SecretKey::size(&this->secretKey);
  strHex<unsigned_char_const*>(&local_58,this_00,(uchar *)(sVar1 & 0xffffffff),in_ECX);
  Json::Value::Value(&local_38,&local_58);
  pVVar2 = Json::Value::operator[]((Value *)local_28,"validation_secret_key");
  Json::Value::operator=(pVVar2,&local_38);
  Json::Value::~Value(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  Json::Value::Value(local_78,&this->manifest);
  pVVar2 = Json::Value::operator[]((Value *)local_28,"manifest");
  Json::Value::operator=(pVVar2,local_78);
  Json::Value::~Value(local_78);
  Json::to_string_abi_cxx11_(&local_98,(Json *)local_28,value);
  beast::detail::base64_encode(__return_storage_ptr__,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  Json::Value::~Value((Value *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string
ValidatorToken::toString () const
{
    Json::Value jv;
    jv["validation_secret_key"] = strHex(secretKey.data(), secretKey.size());
    jv["manifest"] = manifest;

    return beast::detail::base64_encode(to_string(jv));
}